

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O1

int rtp_pkt_unpack(rtp_pkt_t *pkt)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  rtp_bits_t rVar5;
  size_t sVar6;
  uchar *ptr;
  uchar *local_18;
  
  if (pkt == (rtp_pkt_t *)0x0) {
    __assert_fail("pkt != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp.c",0xbc,
                  "int rtp_pkt_unpack(rtp_pkt_t *)");
  }
  bVar1 = pkt->data[0];
  rVar5 = (rtp_bits_t)((uint)pkt->b & 0xfffffffc | (uint)(bVar1 >> 6));
  pkt->b = rVar5;
  iVar4 = 0;
  if (bVar1 >> 6 == 2) {
    pkt->b = (rtp_bits_t)
             ((pkt->data[1] & 0x7f) << 9 |
             ((uint)(byte)(bVar1 << 4 | bVar1 >> 3 & 4 | bVar1 >> 1 & 8) | (uint)rVar5 & 0xffff0002)
             + (pkt->data[1] & 0xffffff80) * 2);
    local_18 = pkt->data + 2;
    uVar3 = uint16_unpack__(&local_18);
    *(short *)&(pkt->b).field_0x2 = (short)uVar3;
    uVar3 = uint32_unpack__(&local_18);
    pkt->timestamp = (ulong)uVar3;
    local_18 = local_18 + 4;
    if ((pkt->unpack != (_func_int_rtp_pkt_s_ptr *)0x0) && (iVar4 = (*pkt->unpack)(pkt), iVar4 == 0)
       ) {
      return 0;
    }
    rVar5 = pkt->b;
    if (((uint)rVar5 & 4) == 0) {
      uVar2 = '\0';
    }
    else {
      uVar2 = pkt->data[pkt->length - 1];
    }
    sVar6 = pkt->length - (ulong)(((uint)rVar5 >> 2 & 0x3c) + pkt->hlen);
    pkt->plen = uVar2;
    pkt->length = sVar6;
    iVar4 = 1;
    if (((uint)rVar5 & 4) != 0) {
      pkt->length = sVar6 + ~(ulong)pkt->plen;
    }
  }
  return iVar4;
}

Assistant:

int rtp_pkt_unpack(rtp_pkt_t *pkt) {
  assert(pkt != NULL);
  
  /* v: 2 bits, p: 1 bit, x: 1 bit, cc: 4 bits */
  pkt->b.v  = (pkt->data[0] >> 6) & 0x3;
  /* check version */
  if (pkt->b.v != 2)
    return 0;
  pkt->b.p  = (pkt->data[0] >> 5) & 0x1;
  pkt->b.x  = (pkt->data[0] >> 4) & 0x1;
  pkt->b.cc = (pkt->data[0])      & 0xf;

  /* m: 1 bit, pt: 7 bits */
  pkt->b.m  = (pkt->data[1] >> 7) & 0x1;
  pkt->b.pt = (pkt->data[1])      & 0x7f;

  unsigned char *ptr = pkt->data + 2;
  /* seq: 16 bits */
  pkt->b.seq = UINT16_UNPACK(ptr);
  /* timestamp: 32 bits */
  pkt->timestamp = UINT32_UNPACK(ptr);
  /* ssrc: 32 bits, just ignore it */
  ptr += 4;

  if (pkt->unpack)
    if (!pkt->unpack(pkt))
      return 0;

  /*M
    If padding is used, then padding length is in last byte.
  **/
  if (pkt->b.p) {
    unsigned char *plen = pkt->data + pkt->length - 1;
    pkt->plen = *plen;
  } else {
    pkt->plen = 0;
  }
  

  /*M
    Ignore rest of packet for now.
  **/
  pkt->length -= pkt->hlen + pkt->b.cc * RTP_CSRC_SIZE;
  if (pkt->b.p)
    pkt->length -= pkt->plen + 1;

  return 1;
}